

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall so_5::environment_t::impl__run_layers_and_go_further(environment_t *this)

{
  allocator local_e1;
  anon_class_8_1_8991fb9c local_e0 [13];
  string local_78 [96];
  
  std::__cxx11::string::string(local_78,"run_layers",&local_e1);
  local_e0[0].this = this;
  impl::layer_core_t::start
            (&((this->m_impl)._M_t.
               super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
               .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->
              m_layer_core);
  impl__run_dispatcher_and_go_further(this);
  impl__run_layers_and_go_further::anon_class_8_1_8991fb9c::operator()(local_e0);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void
environment_t::impl__run_layers_and_go_further()
{
	impl::run_stage(
			"run_layers",
			[this] { m_impl->m_layer_core.start(); },
			[this] { m_impl->m_layer_core.finish(); },
			[this] { impl__run_dispatcher_and_go_further(); } );
}